

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CreateGraphicalElement
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZGraphMesh *grmesh,int dimension)

{
  bool bVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  TPZGraphElT3d *this_00;
  TPZCompEl *cel;
  TPZGraphMesh *gg;
  int in_EDX;
  long *in_RDI;
  bool to_postpro;
  int nsides;
  int matid;
  TPZBndCond *BDC;
  TPZMaterial *material;
  TPZGeoEl *ref;
  TPZGraphMesh *in_stack_ffffffffffffff60;
  TPZCompEl *in_stack_ffffffffffffff68;
  TPZGraphMesh *in_stack_ffffffffffffff70;
  long local_68;
  
  pTVar3 = TPZCompEl::Reference(in_stack_ffffffffffffff68);
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x210))();
  if (iVar2 == in_EDX) {
    plVar4 = (long *)(**(code **)(*in_RDI + 0xb8))();
    if (plVar4 == (long *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = __dynamic_cast(plVar4,&TPZMaterial::typeinfo,&TPZBndCond::typeinfo,
                                0xfffffffffffffffe);
    }
    if (local_68 == 0) {
      (**(code **)(*plVar4 + 0x58))();
      iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))();
      bVar1 = TPZGraphMesh::Material_Is_PostProcessed
                        (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if ((in_EDX == 2) && (bVar1)) {
        if (iVar2 == 9) {
          operator_new(0x28);
          TPZGraphElQ2dd::TPZGraphElQ2dd
                    ((TPZGraphElQ2dd *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60);
          return;
        }
        if (iVar2 == 7) {
          operator_new(0x28);
          TPZGraphElT2dMapped::TPZGraphElT2dMapped
                    ((TPZGraphElT2dMapped *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60);
          return;
        }
      }
      if ((in_EDX == 3) && (bVar1)) {
        if (iVar2 == 0x1b) {
          operator_new(0x28);
          TPZGraphElQ3dd::TPZGraphElQ3dd
                    ((TPZGraphElQ3dd *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60);
          return;
        }
        if (iVar2 == 0x15) {
          operator_new(0x28);
          TPZGraphElPrismMapped::TPZGraphElPrismMapped
                    ((TPZGraphElPrismMapped *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60);
          return;
        }
        if (iVar2 == 0xf) {
          this_00 = (TPZGraphElT3d *)operator_new(0x28);
          TPZGraphElT3d::TPZGraphElT3d(this_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          return;
        }
        if (iVar2 == 0x13) {
          cel = (TPZCompEl *)operator_new(0x28);
          TPZGraphElPyramidMapped::TPZGraphElPyramidMapped
                    ((TPZGraphElPyramidMapped *)in_stack_ffffffffffffff70,cel,
                     in_stack_ffffffffffffff60);
          return;
        }
      }
      if ((in_EDX == 1) && (bVar1)) {
        gg = (TPZGraphMesh *)operator_new(0x28);
        TPZGraphEl1dd::TPZGraphEl1dd
                  ((TPZGraphEl1dd *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,gg);
      }
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CreateGraphicalElement(TPZGraphMesh &grmesh, int dimension)
{
    
    
    TPZGeoEl *ref = Reference();
    if (ref->Dimension() != dimension) {
        return;
    }
    TPZMaterial * material = Material();
    
    TPZBndCond * BDC = dynamic_cast<TPZBndCond * > (material);
    
    if (BDC) {
        return;
    }
    int matid = material->Id();
    int nsides = ref->NSides();
    bool to_postpro = grmesh.Material_Is_PostProcessed(matid);
    if(dimension == 2 && to_postpro){
        if(nsides == 9){
            new TPZGraphElQ2dd(this,&grmesh);
            return;
        }
        if(nsides == 7){
            new TPZGraphElT2dMapped(this,&grmesh);
            return;
        }
    }//2d
    
    if(dimension == 3 && to_postpro){
        if(nsides == 27){
            new TPZGraphElQ3dd(this,&grmesh);
            return;
        }//cube
        if(nsides == 21){
            new TPZGraphElPrismMapped(this,&grmesh);
            return;
        }//prism
        if(nsides == 15){
            new TPZGraphElT3d(this,&grmesh);
            return;
        }//tetra
        if(nsides == 19){
            new TPZGraphElPyramidMapped(this,&grmesh);
            return;
        }//pyram
    }//3d
    
    if(dimension == 1  && to_postpro){
        new TPZGraphEl1dd(this,&grmesh);
    }//1d
}